

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetItemAccessors
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          uint32 index,Var getter,Var setter)

{
  JavascriptLibrary *library;
  IndexPropertyDescriptorMap *this_00;
  bool bVar1;
  BOOL BVar2;
  Var setter_00;
  undefined1 local_60 [8];
  uint32 newLength;
  DynamicObject *local_48;
  IndexPropertyDescriptor *local_40;
  IndexPropertyDescriptor *descriptor;
  
  if ((this->lengthWritable != false) ||
     (BVar2 = 0, index < (arr->super_JavascriptArray).super_ArrayObject.length)) {
    library = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    local_48 = instance;
    if (getter == (Var)0x0) {
      descriptor = (IndexPropertyDescriptor *)0x0;
    }
    else {
      descriptor = (IndexPropertyDescriptor *)
                   DynamicTypeHandler::CanonicalizeAccessor(getter,library);
    }
    if (setter == (Var)0x0) {
      setter_00 = (void *)0x0;
    }
    else {
      setter_00 = DynamicTypeHandler::CanonicalizeAccessor(setter,library);
    }
    JavascriptArray::DirectDeleteItemAt<void*>(&arr->super_JavascriptArray,index);
    bVar1 = IndexPropertyDescriptorMap::TryGetReference
                      ((this->indexPropertyMap).ptr,index,&local_40);
    if (bVar1) {
      if ((local_40->Attributes & 8) != 0) {
        local_40->Attributes = '\a';
      }
      if (descriptor != (IndexPropertyDescriptor *)0x0) {
        Memory::WriteBarrierPtr<void>::WriteBarrierSet(&local_40->Getter,descriptor);
      }
      if (setter_00 != (void *)0x0) {
        Memory::WriteBarrierPtr<void>::WriteBarrierSet(&local_40->Setter,setter_00);
      }
    }
    else {
      this_00 = (this->indexPropertyMap).ptr;
      IndexPropertyDescriptor::IndexPropertyDescriptor
                ((IndexPropertyDescriptor *)local_60,descriptor,setter_00);
      IndexPropertyDescriptorMap::Add(this_00,index,(IndexPropertyDescriptor *)local_60);
    }
    if ((arr->super_JavascriptArray).super_ArrayObject.length <= index) {
      local_60._0_4_ = index;
      UInt32Math::Inc((uint32 *)local_60);
      JavascriptArray::SetLength(&arr->super_JavascriptArray,local_60._0_4_);
    }
    DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
    if (((this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags &
        0x20) != 0) {
      Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
      WriteBarrierSet((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)
                      local_60,&((((local_48->super_RecyclableObject).type.ptr)->javascriptLibrary).
                                ptr)->typesWithOnlyWritablePropertyProtoChain);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)
                 CONCAT44(local_60._4_4_,local_60._0_4_));
    }
    BVar2 = 1;
  }
  return BVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItemAccessors(ES5Array* arr, DynamicObject* instance, uint32 index, Var getter, Var setter)
    {
        // Reject if we need to grow non-writable length
        if (!CanSetItemAt(arr, index))
        {
            return false;
        }

        JavascriptLibrary* lib = instance->GetLibrary();
        if (getter)
        {
            getter = this->CanonicalizeAccessor(getter, lib);
        }
        if (setter)
        {
            setter = this->CanonicalizeAccessor(setter, lib);
        }

        // conversion from data-property to accessor property
        arr->DirectDeleteItemAt<Var>(index);

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }
            if (getter)
            {
                descriptor->Getter = getter;
            }
            if (setter)
            {
                descriptor->Setter = setter;
            }
        }
        else
        {
            indexPropertyMap->Add(index, IndexPropertyDescriptor(getter, setter));
        }

        if (arr->GetLength() <= index)
        {
            uint32 newLength = index;
            UInt32Math::Inc(newLength);
            arr->SetLength(newLength);
        }

        this->ClearHasOnlyWritableDataProperties();
        if(this->GetFlags() & this->IsPrototypeFlag)
        {
            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }
        return true;
    }